

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_true,_false>::unfix_
          (DaTrie<true,_true,_false> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  int *piVar1;
  uint uVar2;
  pointer pBVar3;
  Bc BVar4;
  pointer pBVar5;
  ulong uVar6;
  ulong uVar7;
  uint block_pos;
  
  uVar7 = (ulong)node_pos;
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar3 >> 3) <= uVar7) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x46a,
                  "void ddd::DaTrie<true, true, false>::unfix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  BVar4 = pBVar3[uVar7];
  if ((long)BVar4 < 0) {
    block_pos = node_pos >> 8;
    pBVar5 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(int *)((long)&pBVar5->num_emps + (ulong)(block_pos << 4)) == 0) {
      pBVar3[uVar7] = (Bc)((ulong)BVar4 & 0xffffffff00000000 | (ulong)(node_pos & 0x7fffffff));
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3[uVar7] =
           (Bc)((ulong)pBVar3[uVar7] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
      *(uint32_t *)
       ((long)&((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                _M_impl.super__Vector_impl_data._M_start)->head + (ulong)(block_pos << 4)) =
           node_pos;
      insert_block_link_(this,block_pos,blocks);
    }
    else {
      uVar2 = *(uint *)((long)&pBVar5->head + (ulong)(block_pos << 4));
      pBVar3[uVar7] =
           (Bc)((ulong)BVar4 & 0x80000000ffffffff | (ulong)pBVar3[uVar2] & 0x7fffffff00000000);
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3[uVar7] = (Bc)((ulong)(uVar2 & 0x7fffffff) | (ulong)pBVar3[uVar7] & 0xffffffff00000000);
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (ulong)pBVar3[uVar2] >> 0x1d & 0x3fffffff8;
      *(ulong *)(&pBVar3->field_0x0 + uVar6) =
           *(ulong *)(&pBVar3->field_0x0 + uVar6) & 0xffffffff00000000 |
           (ulong)(node_pos & 0x7fffffff);
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3[uVar2] =
           (Bc)((ulong)pBVar3[uVar2] & 0x80000000ffffffff | (ulong)(node_pos & 0x7fffffff) << 0x20);
    }
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start + uVar7;
    *pBVar3 = (Bc)((ulong)*pBVar3 & 0x7fffffffffffffff);
    this->bc_emps_ = this->bc_emps_ + 1;
    piVar1 = (int *)((long)&((blocks->
                             super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>).
                             _M_impl.super__Vector_impl_data._M_start)->num_emps +
                    (ulong)(block_pos << 4));
    *piVar1 = *piVar1 + 1;
    if (block_pos ==
        (int)((ulong)((long)(this->blocks_).
                            super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->blocks_).
                           super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 4) - 1U) {
      do {
        if ((blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
            super__Vector_impl_data._M_start[block_pos].num_emps != 0x100) {
          return;
        }
        pop_block_(this);
        block_pos = block_pos - 1;
      } while ((int)((ulong)((long)(this->blocks_).
                                   super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->blocks_).
                                  super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0);
    }
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x46b,
                "void ddd::DaTrie<true, true, false>::unfix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (blocks[block_pos].num_emps == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      blocks[block_pos].head = node_pos;
      insert_block_link_(block_pos, blocks);
    } else {
      auto head = blocks[block_pos].head;
      set_prev_(node_pos, prev_(head));
      set_next_(node_pos, head);
      set_next_(prev_(head), node_pos);
      set_prev_(head, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }